

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O2

void __thiscall fs_tests::rename::test_method(rename *this)

{
  long lVar1;
  path src;
  path dest;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  check_type cVar5;
  undefined8 in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb1;
  undefined8 in_stack_fffffffffffffbb8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffbc0;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  string contents;
  ofstream file;
  path local_190;
  path local_168;
  string path2_contents;
  string path1_contents;
  path local_100;
  path path2;
  path local_b0;
  path path1;
  path tmpfolder;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  std::filesystem::__cxx11::path::path(&local_b0,&tmpfolder.super_path);
  fs::operator/(&path1,(path *)&local_b0,"a");
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::path(&local_100,&tmpfolder.super_path);
  fs::operator/(&path2,(path *)&local_100,"b");
  std::filesystem::__cxx11::path::~path(&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path1_contents,"1111",(allocator<char> *)&file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path2_contents,"2222",(allocator<char> *)&file);
  std::ofstream::ofstream(&file,path1.super_path._M_pathname._M_dataplus._M_p,_S_out);
  std::operator<<((ostream *)&file,(string *)&path1_contents);
  std::ofstream::~ofstream(&file);
  std::ofstream::ofstream(&file,path2.super_path._M_pathname._M_dataplus._M_p,_S_out);
  std::operator<<((ostream *)&file,(string *)&path2_contents);
  std::ofstream::~ofstream(&file);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file_00.m_end = (iterator)0x81;
  file_00.m_begin = (iterator)&local_3c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3d8,msg);
  std::filesystem::__cxx11::path::path(&local_168,&path1.super_path);
  std::filesystem::__cxx11::path::path(&local_190,&path2.super_path);
  src.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb7c;
  src.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb78;
  src.super_path._M_pathname._M_string_length = (size_type)_cVar5;
  src.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffb88;
  src.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffb90;
  src.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffb98._M_head_impl;
  dest.super_path._M_pathname._M_string_length = in_stack_fffffffffffffba8;
  dest.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  dest.super_path._M_pathname.field_2._M_local_buf[0] = in_stack_fffffffffffffbb0;
  dest.super_path._M_pathname.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffffbb1;
  dest.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffbb8;
  dest.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffbc0._M_head_impl;
  bVar2 = RenameOver(src,dest);
  contents._M_dataplus._M_p._0_1_ = bVar2;
  contents._M_string_length = 0;
  contents.field_2._M_allocated_capacity = 0;
  _file = &PTR__lazy_ostream_0113a070;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_3e0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&contents,(lazy_ostream *)&file,1,0,WARN,_cVar5,(size_t)&local_3e8,
             0x81);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&contents.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path(&local_190);
  std::filesystem::__cxx11::path::~path(&local_168);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_01.m_end = (iterator)0x83;
  file_01.m_begin = (iterator)&local_3f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_408,
             msg_00);
  bVar2 = std::filesystem::exists(&path1.super_path);
  contents._M_dataplus._M_p._0_1_ = !bVar2;
  contents._M_string_length = 0;
  contents.field_2._M_allocated_capacity = 0;
  _file = &PTR__lazy_ostream_0113a070;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_410 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&contents,(lazy_ostream *)&file,1,0,WARN,_cVar5,(size_t)&local_418,
             0x83);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&contents.field_2._M_allocated_capacity);
  std::ifstream::ifstream(&file,path2.super_path._M_pathname._M_dataplus._M_p,_S_in);
  contents._M_string_length = 0;
  contents.field_2._M_allocated_capacity =
       contents.field_2._M_allocated_capacity & 0xffffffffffffff00;
  contents._M_dataplus._M_p = (pointer)&contents.field_2;
  std::operator>>((istream *)&file,(string *)&contents);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_02.m_end = (iterator)0x89;
  file_02.m_begin = (iterator)&local_428;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_438,
             msg_01);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&stack0xfffffffffffffba8,&stack0xfffffffffffffb98,0x89,1,2,&contents,0xb5e757,
             &path1_contents,"path1_contents");
  std::__cxx11::string::~string((string *)&contents);
  std::ifstream::~ifstream(&file);
  std::filesystem::remove((path *)&path2);
  std::__cxx11::string::~string((string *)&path2_contents);
  std::__cxx11::string::~string((string *)&path1_contents);
  std::filesystem::__cxx11::path::~path(&path2.super_path);
  std::filesystem::__cxx11::path::~path(&path1.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rename)
{
    const fs::path tmpfolder{m_args.GetDataDirBase()};

    const fs::path path1{tmpfolder / "a"};
    const fs::path path2{tmpfolder / "b"};

    const std::string path1_contents{"1111"};
    const std::string path2_contents{"2222"};

    {
        std::ofstream file{path1};
        file << path1_contents;
    }

    {
        std::ofstream file{path2};
        file << path2_contents;
    }

    // Rename path1 -> path2.
    BOOST_CHECK(RenameOver(path1, path2));

    BOOST_CHECK(!fs::exists(path1));

    {
        std::ifstream file{path2};
        std::string contents;
        file >> contents;
        BOOST_CHECK_EQUAL(contents, path1_contents);
    }
    fs::remove(path2);
}